

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool __thiscall httplib::Server::set_base_dir(Server *this,char *dir,char *mount_point)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  char *local_b0;
  allocator<char> local_81;
  undefined1 local_80 [8];
  string mnt;
  allocator<char> local_49;
  string local_48;
  char *local_28;
  char *mount_point_local;
  char *dir_local;
  Server *this_local;
  
  local_28 = mount_point;
  mount_point_local = dir;
  dir_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,dir,&local_49);
  bVar1 = detail::is_dir(&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  if (bVar1) {
    if (local_28 == (char *)0x0) {
      local_b0 = "/";
    }
    else {
      local_b0 = local_28;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_80,local_b0,&local_81);
    std::allocator<char>::~allocator(&local_81);
    uVar2 = std::__cxx11::string::empty();
    if (((uVar2 & 1) == 0) &&
       (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)local_80), *pcVar3 == '/')) {
      std::
      vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<std::__cxx11::string&,char_const*&>
                ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                  *)&this->base_dirs_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80,
                 &mount_point_local);
      this_local._7_1_ = 1;
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
    std::__cxx11::string::~string((string *)local_80);
    if (bVar1) goto LAB_001fa2fa;
  }
  this_local._7_1_ = 0;
LAB_001fa2fa:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

inline bool Server::set_base_dir(const char *dir, const char *mount_point) {
  if (detail::is_dir(dir)) {
    std::string mnt = mount_point ? mount_point : "/";
    if (!mnt.empty() && mnt[0] == '/') {
      base_dirs_.emplace_back(mnt, dir);
      return true;
    }
  }
  return false;
}